

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::CreatePBufferSurface::exec(CreatePBufferSurface *this,Thread *t)

{
  _func_int **pp_Var1;
  deUint32 err;
  Thread *pTVar2;
  MessageBuilder *pMVar3;
  EGLSurface pvVar4;
  EGLint attriblist [5];
  undefined4 local_1c8;
  EGLint local_1c4;
  undefined4 local_1c0;
  EGLint local_1bc;
  undefined4 local_1b8;
  undefined1 local_1b0 [400];
  
  pTVar2 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (pTVar2 != (Thread *)0x0) {
    local_1c8 = 0x3057;
    local_1c4 = this->m_width;
    local_1c0 = 0x3056;
    local_1bc = this->m_height;
    local_1b8 = 0x3038;
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 0x18),"Begin -- eglCreatePbufferSurface(");
    pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&this->m_display);
    std::operator<<((ostream *)&pMVar3->field_0x18,", ");
    pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,&this->m_config);
    std::operator<<((ostream *)&pMVar3->field_0x18,", { EGL_WIDTH, ");
    pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,&this->m_width);
    std::operator<<((ostream *)&pMVar3->field_0x18,", EGL_HEIGHT, ");
    pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,&this->m_height);
    std::operator<<((ostream *)&pMVar3->field_0x18,", EGL_NONE })");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    pp_Var1 = pTVar2[1].super_Thread._vptr_Thread;
    pvVar4 = (EGLSurface)
             (**(code **)(*pp_Var1 + 0x50))(pp_Var1,this->m_display,this->m_config,&local_1c8);
    ((this->m_surface).m_ptr)->surface = pvVar4;
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 0x18),"End -- ");
    pMVar3 = tcu::ThreadUtil::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&((this->m_surface).m_ptr)->surface);
    std::operator<<((ostream *)&pMVar3->field_0x18,"= eglCreatePbufferSurface()");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar3,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    err = (**(code **)(*pTVar2[1].super_Thread._vptr_Thread + 0xf8))();
    eglu::checkError(err,"eglCreatePbufferSurface()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                     ,0x33d);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void CreatePBufferSurface::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	const EGLint attriblist[] = {
		EGL_WIDTH, m_width,
		EGL_HEIGHT, m_height,
		EGL_NONE
	};

	thread.newMessage() << "Begin -- eglCreatePbufferSurface(" << m_display << ", " << m_config << ", { EGL_WIDTH, " << m_width << ", EGL_HEIGHT, " << m_height << ", EGL_NONE })" << tcu::ThreadUtil::Message::End;
	m_surface->surface = thread.egl.createPbufferSurface(m_display, m_config, attriblist);
	thread.newMessage() << "End -- " << m_surface->surface << "= eglCreatePbufferSurface()" << tcu::ThreadUtil::Message::End;
	EGLU_CHECK_MSG(thread.egl, "eglCreatePbufferSurface()");
}